

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defines.cpp
# Opt level: O2

void __thiscall vera::HaveDefines::printDefines(HaveDefines *this)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  
  for (p_Var2 = (this->m_defines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_defines)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<((ostream *)&std::cout,"#define ");
    poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 1));
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 2));
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

void HaveDefines::printDefines() {
    for (DefinesMap_cit it = m_defines.begin(); it != m_defines.end(); ++it)
        std::cout << "#define " << it->first << " " << it->second << std::endl;
}